

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>
          (SlabAllocatorBase<0> *this,size_t reservedCount)

{
  size_t reservedSize;
  size_t reservedCount_local;
  SlabAllocatorBase<0> *this_local;
  
  if (this->m_reserveActiveBytes == 0) {
    TTDAbort_unrecoverable_error("We don\'t have anything reserved.");
  }
  if (reservedCount << 3 < 0x1001) {
    if (this->m_reserveActiveLargeBlock != (LargeSlabBlock *)0x0) {
      TTDAbort_unrecoverable_error("We should not have a large block active!!!");
    }
    this->m_reserveActiveBytes = 0;
  }
  else {
    if (this->m_reserveActiveLargeBlock == (LargeSlabBlock *)0x0) {
      TTDAbort_unrecoverable_error("We should have a large block active!!!");
    }
    Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
              (&Memory::HeapAllocator::Instance,(ulong)this->m_reserveActiveBytes,
               (uchar *)this->m_reserveActiveLargeBlock);
    this->m_reserveActiveLargeBlock = (LargeSlabBlock *)0x0;
    this->m_reserveActiveBytes = 0;
  }
  return;
}

Assistant:

void SlabAbortArraySpace(size_t reservedCount)
        {
            TTDAssert(this->m_reserveActiveBytes != 0, "We don't have anything reserved.");

            size_t reservedSize = reservedCount * sizeof(T);
            if (reservedSize <= TTD_SLAB_LARGE_BLOCK_SIZE)
            {
                TTDAssert(this->m_reserveActiveLargeBlock == nullptr, "We should not have a large block active!!!");

                this->m_reserveActiveBytes = 0;
            }
            else
            {
                TTDAssert(this->m_reserveActiveLargeBlock != nullptr, "We should have a large block active!!!");

                TT_HEAP_FREE_ARRAY(byte, (byte*)this->m_reserveActiveLargeBlock, this->m_reserveActiveBytes);

                this->m_reserveActiveLargeBlock = nullptr;
                this->m_reserveActiveBytes = 0;
            }
        }